

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

HelicsFilter
anon_unknown.dwarf_a089a::coreAddFilter
          (HelicsCore core,
          unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *filt)

{
  FilterObject *pFVar1;
  __normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
  __position;
  
  pFVar1 = (filt->_M_t).
           super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>.
           _M_t.
           super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
           .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl;
  pFVar1->valid = -0x13d9fed9;
  if ((*(long *)((long)core + 0x10) != *(long *)((long)core + 0x18)) &&
     ((pFVar1->filtPtr->super_Interface).handle.hid <=
      *(int *)(*(long *)(*(long *)(*(long *)((long)core + 0x18) + -8) + 8) + 0x10))) {
    __position = std::
                 upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>*,std::vector<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>,std::allocator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>>>,helics::InterfaceHandle,(anonymous_namespace)::__0>
                           ();
    std::
    vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
                      *)((long)core + 0x10),(const_iterator)__position._M_current,filt);
    return pFVar1;
  }
  std::
  vector<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>,std::allocator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>>
  ::emplace_back<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>
            ((vector<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>,std::allocator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>>
              *)((long)core + 0x10),filt);
  return pFVar1;
}

Assistant:

HelicsFilter coreAddFilter(HelicsCore core, std::unique_ptr<helics::FilterObject> filt)
{
    auto* coreObj = reinterpret_cast<helics::CoreObject*>(core);
    filt->valid = filterValidationIdentifier;
    HelicsFilter hfilt = filt.get();
    if (coreObj->filters.empty() || filt->filtPtr->getHandle() > coreObj->filters.back()->filtPtr->getHandle()) {
        coreObj->filters.push_back(std::move(filt));
    } else {
        auto ind = std::upper_bound(coreObj->filters.begin(), coreObj->filters.end(), filt->filtPtr->getHandle(), filterSearch);
        coreObj->filters.insert(ind, std::move(filt));
    }
    return hfilt;
}